

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O2

bool __thiscall Fossilize::ApplicationInfoFilter::Impl::parse(Impl *this,char *path)

{
  bool bVar1;
  SizeType SVar2;
  int iVar3;
  FILE *__stream;
  size_type __n;
  size_t sVar4;
  Value *pVVar5;
  Ch *pCVar6;
  char *__ptr;
  pointer str;
  pointer pcVar7;
  size_t sStack_f0;
  vector<char,_std::allocator<char>_> buffer;
  Document doc;
  string json_str;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
LAB_0016e2a7:
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    pcVar7 = (pointer)0x0;
    str = (Ch *)0x0;
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    if ((long)__n < 0) {
      fclose(__stream);
      goto LAB_0016e2a7;
    }
    rewind(__stream);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&doc,__n,(allocator_type *)local_48);
    sVar4 = fread((void *)doc.
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          .data_.n,1,__n,__stream);
    fclose(__stream);
    if (sVar4 == __n) {
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)doc.
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          .data_.n;
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = doc.
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  .data_.s.str;
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)doc.allocator_;
      doc.
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      .data_.n = (Number)0x0;
      doc.
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      .data_.s.str = (Ch *)0x0;
      doc.allocator_ = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
    }
    else {
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
    }
    pcVar7 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    str = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&doc);
  }
  bVar1 = false;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&doc,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::Parse<0u,rapidjson::UTF8<char>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&doc,str,(long)pcVar7 - (long)str);
  if (doc.parseResult_.code_ != kParseErrorNone) goto LAB_0016e52c;
  json_str._M_dataplus._M_p = (pointer)&json_str.field_2;
  json_str._M_string_length = 0;
  json_str.field_2._M_local_buf[0] = '\0';
  pVVar5 = get_safe_member(&doc.
                            super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ,"asset");
  if ((pVVar5 == (Value *)0x0) ||
     ((undefined1  [16])((undefined1  [16])pVVar5->data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0)) {
    __ptr = "Fossilize ERROR: Not a string.\n";
    sStack_f0 = 0x1f;
LAB_0016e513:
    fwrite(__ptr,sStack_f0,1,_stderr);
LAB_0016e51c:
    bVar1 = false;
  }
  else {
    pCVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar5);
    SVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength(pVVar5);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pCVar6,pCVar6 + SVar2);
    std::__cxx11::string::operator=((string *)&json_str,(string *)local_48);
    std::__cxx11::string::_M_dispose();
    bVar1 = std::operator!=(&json_str,"FossilizeApplicationInfoFilter");
    if (bVar1) goto LAB_0016e51c;
    pVVar5 = get_safe_member(&doc.
                              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ,"version");
    if ((pVVar5 == (Value *)0x0) ||
       ((undefined1  [16])((undefined1  [16])pVVar5->data_ & (undefined1  [16])0x20000000000000) ==
        (undefined1  [16])0x0)) {
      __ptr = "Fossilize ERROR: Not an int.\n";
      sStack_f0 = 0x1d;
      goto LAB_0016e513;
    }
    iVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetInt(pVVar5);
    if (2 < iVar3) goto LAB_0016e51c;
    pVVar5 = maybe_get_member(&doc.
                               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              ,"blacklistedApplicationNames");
    if (pVVar5 != (Value *)0x0) {
      bVar1 = add_blacklists(&this->blacklisted_application_names,pVVar5);
      if (!bVar1) goto LAB_0016e51c;
    }
    pVVar5 = maybe_get_member(&doc.
                               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              ,"blacklistedEngineNames");
    if (pVVar5 != (Value *)0x0) {
      bVar1 = add_blacklists(&this->blacklisted_engine_names,pVVar5);
      if (!bVar1) goto LAB_0016e51c;
    }
    pVVar5 = maybe_get_member(&doc.
                               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              ,"applicationFilters");
    if (pVVar5 != (Value *)0x0) {
      bVar1 = add_application_filters(&this->application_infos,pVVar5);
      if (!bVar1) goto LAB_0016e51c;
    }
    pVVar5 = maybe_get_member(&doc.
                               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              ,"engineFilters");
    if (pVVar5 != (Value *)0x0) {
      bVar1 = add_application_filters(&this->engine_infos,pVVar5);
      if (!bVar1) goto LAB_0016e51c;
    }
    pVVar5 = maybe_get_member(&doc.
                               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              ,"defaultBucketVariantDependencies");
    if (pVVar5 != (Value *)0x0) {
      bVar1 = parse_bucket_variant_dependencies(pVVar5,&this->default_variant_dependencies);
      if (!bVar1) goto LAB_0016e51c;
    }
    pVVar5 = maybe_get_member(&doc.
                               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              ,"defaultBucketVariantFeatureDependencies");
    if (pVVar5 != (Value *)0x0) {
      bVar1 = parse_bucket_variant_dependencies(pVVar5,&this->default_variant_dependencies_feature);
      if (!bVar1) goto LAB_0016e51c;
    }
    bVar1 = true;
  }
  std::__cxx11::string::_M_dispose();
LAB_0016e52c:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&doc);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  return bVar1;
}

Assistant:

bool ApplicationInfoFilter::Impl::parse(const char *path)
{
	auto buffer = read_file(path);

	Document doc;
	doc.Parse(buffer.data(), buffer.size());
	if (doc.HasParseError())
		return false;

	std::string json_str;
	int json_int;

	if (!get_safe_member_string(doc, "asset", json_str) || json_str != "FossilizeApplicationInfoFilter")
		return false;

	if (!get_safe_member_int(doc, "version", json_int) || json_int > FOSSILIZE_APPLICATION_INFO_FILTER_VERSION)
		return false;

	auto *blacklist = maybe_get_member(doc, "blacklistedApplicationNames");
	if (blacklist)
		if (!add_blacklists(blacklisted_application_names, blacklist))
			return false;
	blacklist = maybe_get_member(doc, "blacklistedEngineNames");
	if (blacklist)
		if (!add_blacklists(blacklisted_engine_names, blacklist))
			return false;

	auto *filters = maybe_get_member(doc, "applicationFilters");
	if (filters)
		if (!add_application_filters(application_infos, filters))
			return false;
	filters = maybe_get_member(doc, "engineFilters");
	if (filters)
		if (!add_application_filters(engine_infos, filters))
			return false;

	auto *default_variants = maybe_get_member(doc, "defaultBucketVariantDependencies");
	if (default_variants)
		if (!parse_bucket_variant_dependencies(*default_variants, default_variant_dependencies))
			return false;

	auto *default_feature_variants = maybe_get_member(doc, "defaultBucketVariantFeatureDependencies");
	if (default_feature_variants)
		if (!parse_bucket_variant_dependencies(*default_feature_variants, default_variant_dependencies_feature))
			return false;

	return true;
}